

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall Selector::threadMain(Selector *this)

{
  bool bVar1;
  Id IVar2;
  int *piVar3;
  Event *this_00;
  bool done;
  Event *ev;
  char buf [10];
  int i_1;
  int res;
  int i;
  int numFds;
  pollfd fds [64];
  bool gotEvent;
  Selector *this_local;
  
  fds[0x3f].revents._1_1_ = 0;
  res = 0;
  fillPollFds(this,(pollfd *)&i,&res);
  while ((this->mRunning & 1U) != 0) {
    for (i_1 = 1; i_1 < res; i_1 = i_1 + 1) {
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf._6_4_ = poll((pollfd *)&i,(long)res,-1);
    if ((((int)buf._6_4_ < 0) && (piVar3 = __errno_location(), *piVar3 != 0)) &&
       (piVar3 = __errno_location(), *piVar3 != 4)) {
      jh_log_print(1,"void Selector::threadMain()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                   ,0xd9,"Poll returned %d",(ulong)(uint)buf._6_4_);
    }
    if (0 < (int)buf._6_4_) {
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      for (; (int)buf._2_4_ < res; buf._2_4_ = buf._2_4_ + 1) {
        if ((&i)[(long)(int)buf._2_4_ * 2] == this->mPipe[0]) {
          if ((fds[(long)(int)buf._2_4_ + -1].revents & 1U) == 0) {
            if ((fds[(long)(int)buf._2_4_ + -1].revents & 0x30U) != 0) {
              jh_log_print(1,"void Selector::threadMain()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                           ,0xf5,"POLLHUP recieved on pipe");
            }
          }
          else {
            read(this->mPipe[0],(void *)((long)&ev + 6),4);
            fds[0x3f].revents._1_1_ = 1;
          }
        }
        else if ((fds[(long)(int)buf._2_4_ + -1].revents != 0) &&
                (bVar1 = callListeners(this,(&i)[(long)(int)buf._2_4_ * 2],
                                       (int)fds[(long)(int)buf._2_4_ + -1].revents), bVar1)) {
          this->mUpdateFds = true;
        }
      }
    }
    if ((fds[0x3f].revents._1_1_ & 1) != 0) {
      this_00 = EventQueue::PollEvent(&(this->super_EventDispatcher).mQueue);
      if (this_00 == (Event *)0x0) {
        jh_log_print(2,"void Selector::threadMain()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                     ,0x112,"got NULL event");
      }
      else {
        IVar2 = Event::getEventId(this_00);
        if (IVar2 == -4) {
          this->mUpdateFds = true;
          RefCount::Release(&this_00->super_RefCount);
        }
        else {
          bVar1 = EventDispatcher::handleEvent(&this->super_EventDispatcher,this_00);
          if (bVar1) {
            this->mRunning = false;
          }
        }
      }
      fds[0x3f].revents._1_1_ = 0;
    }
    if ((this->mUpdateFds & 1U) != 0) {
      fillPollFds(this,(pollfd *)&i,&res);
      this->mUpdateFds = false;
    }
    Condition::Broadcast(&this->mCondition);
  }
  return;
}

Assistant:

void Selector::threadMain()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	bool gotEvent = false;
	struct pollfd	fds[ kMaxPollFds ];
	int				numFds = 0;
	
	fillPollFds( fds, numFds );
	
	// Event will be sent by EventThread on exit
	while( mRunning )
	{
		LOG( "%p on %d files", this, numFds );
		for ( int i = 1; i < numFds; i++ )
		{
			LOG( "%p fd %d", this, fds[ i ].fd );
		}
		
		// set errno to zero
		// this is being set to better monitor the behavior of poll on
		// the 7401 until poll gets fixed
		errno = 0;
		int res = 0;
		
		// test here to ensure that errno cannot be modified before it is tested.
		if ( ( res = poll( fds, numFds, -1 ) ) < 0 )
		{
			// for whatever reason, there are times when poll returns -1,
			// but doesn't set errno
			if (errno == 0)
				LOG_NOTICE( "Poll returned %d, but didn't set errno", res);
			else if (errno == EINTR)
				LOG_NOISE( "Poll was interrupted" );
			else
				LOG_ERR_PERROR( "Poll returned %d", res );
		}
		
		LOG( "%p woke up %d", this, res );
		
		if ( res > 0 )
		{
			LOG( "got %d from poll", res );
			
			for ( int i = 0; i < numFds; i++ )
			{
				if ( fds[ i ].fd == mPipe[ PIPE_READER ] )
				{
					LOG( "got %x on pipe %d", fds[ 0 ].revents, fds[ i ].fd );
					if ( fds[ i ].revents & POLLIN )
					{
						char buf[10];
						read( mPipe[ PIPE_READER ], &buf, 4 );
						
						// We need to handle events after we handle file
						// descriptor polls because one of the events
						// that we handle modifies the current list of
						// file descriptors for poll and we need to handle
						// any that occured before updating them.
						gotEvent = true;
					}			
					else if ( fds[ i ].revents & ( POLLHUP | POLLNVAL ) )
					{
						LOG_ERR_FATAL( "POLLHUP recieved on pipe" );
					}
				}
				else
				{
					LOG_NOISE( "got %x on fd %d", fds[ i ].revents, fds[ i ].fd );
					if ( fds[ i ].revents != 0 )
					{
						// if callListeners removes a listener we need to update 
						//  Fds.  However only set if callListeners returns true
						//  This should not be cleared since one of the listeners
						//  could have called removeListener and that call might 
						//  have set mUpdateFds
						if ( callListeners( fds[ i ].fd, fds[ i ].revents ) )
							mUpdateFds = true;
					}
				}
			}
		}

		// Now that file descriptors have been handled we can deal with
		// events if needed, including updating the poll file descriptor
		// list if it's been changed.
		if ( gotEvent )
		{
			Event *ev = mQueue.PollEvent();

			if ( ev == NULL )
			{
				LOG_WARN( "got NULL event" );
			}
			else if ( ev->getEventId() == Event::kSelectorUpdateEventId )
			{
				LOG( "got kSelectorUpdateEventId" );
				mUpdateFds = true;
				ev->Release();
			}
			else
			{
				LOG( "got event %d", ev->getEventId() );
				bool done = EventDispatcher::handleEvent( ev );
				if ( done )
					mRunning = false;
			}
			
			gotEvent = false;
		}
		
		if ( mUpdateFds )
		{
			fillPollFds( fds, numFds );
			mUpdateFds = false;
		}
		
		mCondition.Broadcast();
	}
	
	LOG_NOTICE( "Thread exiting" );
}